

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O2

Conjuncts *
BuildConjuncts(DdManager *dd,DdNode *node,st__table *distanceTable,st__table *cacheTable,
              int approxDistance,int maxLocalRef,st__table *ghTable,st__table *mintermTable)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  Conjuncts *pCVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  int *piVar10;
  uint uVar11;
  ulong uVar12;
  DdNode *pDVar13;
  DdNode *pDVar14;
  uint uVar15;
  double dVar16;
  double dVar17;
  char *value;
  double *doubleDummy;
  st__table *local_58;
  DdNode *local_50;
  int outOfMem;
  NodeStat *nodeStat;
  Conjuncts *dummy;
  
  piVar10 = (int *)((ulong)node & 0xfffffffffffffffe);
  if (*piVar10 == 0x7fffffff) {
    pDVar5 = (DdNode *)malloc(0x10);
    if (pDVar5 == (DdNode *)0x0) goto LAB_00611856;
    *(DdNode **)pDVar5 = node;
  }
  else {
    iVar4 = st__lookup(cacheTable,(char *)node,(char **)&dummy);
    if (iVar4 != 0) {
      return dummy;
    }
    local_58 = cacheTable;
    iVar4 = st__lookup(distanceTable,(char *)piVar10,(char **)&nodeStat);
    if (iVar4 == 0) {
      fwrite("Not in table, Something wrong\n",0x1e,1,(FILE *)dd->err);
      dd->errorCode = CUDD_INTERNAL_ERROR;
      return (Conjuncts *)0x0;
    }
    iVar4 = nodeStat->distance;
    if ((int)((uint)(maxLocalRef * 2) / 3) < nodeStat->localRef) {
      if ((int)((uint)(approxDistance * 2) / 3) <= iVar4 && (int)((uint)approxDistance >> 2) < iVar4
         ) {
LAB_006118a0:
        uVar2 = *(ulong *)(piVar10 + 6);
        uVar12 = (ulong)((uint)node & 1);
        pDVar5 = (DdNode *)(uVar12 ^ *(ulong *)(piVar10 + 4));
        dVar17 = 0.0;
        if (*(int *)(*(ulong *)(piVar10 + 4) & 0xfffffffffffffffe) != 0x7fffffff) {
          iVar4 = st__lookup(mintermTable,(char *)pDVar5,(char **)&doubleDummy);
          if (iVar4 == 0) goto LAB_00611a26;
          dVar17 = *(double *)CONCAT44(doubleDummy._4_4_,(int)doubleDummy);
        }
        dVar16 = 0.0;
        pDVar13 = (DdNode *)(uVar12 ^ uVar2);
        if (*(int *)(uVar2 & 0xfffffffffffffffe) != 0x7fffffff) {
          iVar4 = st__lookup(mintermTable,(char *)pDVar13,(char **)&doubleDummy);
          if (iVar4 == 0) {
LAB_00611a26:
            fwrite("Not in table: Something wrong\n",0x1e,1,(FILE *)dd->err);
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return (Conjuncts *)0x0;
          }
          dVar16 = *(double *)CONCAT44(doubleDummy._4_4_,(int)doubleDummy);
        }
        pDVar9 = pDVar5;
        if (dVar17 < dVar16) {
          pDVar9 = pDVar13;
          pDVar13 = pDVar5;
        }
        if (pDVar9 == zero) {
          pDVar8 = (DdNode *)0x0;
          uVar15 = 0;
          pDVar5 = pDVar9;
        }
        else {
          local_50 = pDVar13;
          pDVar6 = (DdNode *)
                   BuildConjuncts(dd,pDVar9,distanceTable,local_58,approxDistance,maxLocalRef,
                                  ghTable,mintermTable);
          if (pDVar6 == (DdNode *)0x0) {
            return (Conjuncts *)0x0;
          }
          pDVar14 = (DdNode *)((ulong)pDVar6 ^ 1);
          uVar15 = (uint)pDVar6 & 1;
          pDVar8 = pDVar6;
          if (((ulong)pDVar6 & 1) != 0) {
            pDVar8 = pDVar14;
          }
          uVar2._0_4_ = pDVar8->index;
          uVar2._4_4_ = pDVar8->ref;
          piVar1 = (int *)((uVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)(((ulong)pDVar8->next & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar5 = zero;
          pDVar13 = local_50;
          if (local_50 == zero) {
            pCVar7 = ZeroCase(dd,node,(Conjuncts *)pDVar8,ghTable,local_58,(uint)(dVar17 < dVar16));
            goto joined_r0x00611d50;
          }
        }
        uVar11 = 0;
        if (pDVar13 == pDVar5) {
          pDVar5 = (DdNode *)0x0;
LAB_00611b53:
          pDVar13 = pDVar8;
          uVar3 = uVar15;
          if (dVar17 < dVar16) {
            pDVar13 = pDVar5;
            pDVar5 = pDVar8;
            uVar3 = uVar11;
            uVar11 = uVar15;
          }
          pDVar9 = dd->vars[*piVar10];
          pDVar6 = cuddBddIteRecur(dd,pDVar9,*(DdNode **)pDVar13,*(DdNode **)pDVar5);
          if (pDVar6 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,*(DdNode **)pDVar13);
            Cudd_RecursiveDeref(dd,pDVar13->next);
            Cudd_RecursiveDeref(dd,*(DdNode **)pDVar5);
            pDVar6 = pDVar5->next;
          }
          else {
            piVar10 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar10 = *piVar10 + 1;
            pDVar14 = cuddBddIteRecur(dd,pDVar9,pDVar13->next,pDVar5->next);
            if (pDVar14 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,*(DdNode **)pDVar13);
              Cudd_RecursiveDeref(dd,pDVar13->next);
              Cudd_RecursiveDeref(dd,*(DdNode **)pDVar5);
              Cudd_RecursiveDeref(dd,pDVar5->next);
            }
            else {
              piVar10 = (int *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4);
              *piVar10 = *piVar10 + 1;
              pDVar8 = cuddBddIteRecur(dd,pDVar9,*(DdNode **)pDVar13,pDVar5->next);
              if (pDVar8 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,pDVar13->next);
                Cudd_RecursiveDeref(dd,*(DdNode **)pDVar13);
                Cudd_RecursiveDeref(dd,*(DdNode **)pDVar5);
                Cudd_RecursiveDeref(dd,pDVar5->next);
                Cudd_RecursiveDeref(dd,pDVar6);
                pDVar6 = pDVar14;
              }
              else {
                piVar10 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
                *piVar10 = *piVar10 + 1;
                Cudd_RecursiveDeref(dd,*(DdNode **)pDVar13);
                Cudd_RecursiveDeref(dd,pDVar5->next);
                pDVar9 = cuddBddIteRecur(dd,pDVar9,pDVar13->next,*(DdNode **)pDVar5);
                if (pDVar9 != (DdNode *)0x0) {
                  piVar10 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
                  *piVar10 = *piVar10 + 1;
                  Cudd_RecursiveDeref(dd,pDVar13->next);
                  Cudd_RecursiveDeref(dd,*(DdNode **)pDVar5);
                  if (uVar3 != 0) {
                    free(pDVar13);
                  }
                  if (uVar11 != 0) {
                    free(pDVar5);
                  }
                  pCVar7 = CheckInTables(node,pDVar6,pDVar14,pDVar8,pDVar9,ghTable,local_58,
                                         &outOfMem);
                  if (outOfMem != 0) {
                    dd->errorCode = CUDD_MEMORY_OUT;
                    Cudd_RecursiveDeref(dd,pDVar6);
                    Cudd_RecursiveDeref(dd,pDVar14);
                    Cudd_RecursiveDeref(dd,pDVar8);
LAB_00611d1f:
                    Cudd_RecursiveDeref(dd,pDVar9);
                    return (Conjuncts *)0x0;
                  }
                  if (pCVar7 == (Conjuncts *)0x0) {
                    pCVar7 = PickOnePair(node,pDVar6,pDVar14,pDVar8,pDVar9,ghTable,local_58);
                    if (pCVar7 == (Conjuncts *)0x0) {
                      dd->errorCode = CUDD_MEMORY_OUT;
                      Cudd_RecursiveDeref(dd,pDVar6);
                      Cudd_RecursiveDeref(dd,pDVar14);
                      Cudd_RecursiveDeref(dd,pDVar8);
                      goto LAB_00611d1f;
                    }
                    if ((pCVar7->g != pDVar6) && (pCVar7->g != pDVar14)) {
                      Cudd_RecursiveDeref(dd,pDVar6);
                      goto LAB_00612013;
                    }
                  }
                  else if ((pCVar7->g != pDVar6) && (pCVar7->g != pDVar14)) {
                    Cudd_RecursiveDeref(dd,pDVar6);
                    goto LAB_00612013;
                  }
                  Cudd_RecursiveDeref(dd,pDVar8);
                  pDVar14 = pDVar9;
LAB_00612013:
                  Cudd_RecursiveDeref(dd,pDVar14);
                  return pCVar7;
                }
                Cudd_RecursiveDeref(dd,*(DdNode **)pDVar13);
                Cudd_RecursiveDeref(dd,pDVar13->next);
                Cudd_RecursiveDeref(dd,*(DdNode **)pDVar5);
                Cudd_RecursiveDeref(dd,pDVar5->next);
                Cudd_RecursiveDeref(dd,pDVar6);
                Cudd_RecursiveDeref(dd,pDVar14);
                pDVar6 = pDVar8;
              }
            }
          }
          Cudd_RecursiveDeref(dd,pDVar6);
          if (uVar3 != 0) {
            free(pDVar13);
          }
        }
        else {
          local_50 = pDVar8;
          pDVar6 = (DdNode *)
                   BuildConjuncts(dd,pDVar13,distanceTable,local_58,approxDistance,maxLocalRef,
                                  ghTable,mintermTable);
          pDVar5 = local_50;
          if (pDVar6 != (DdNode *)0x0) {
            pDVar14 = (DdNode *)((ulong)pDVar6 ^ 1);
            uVar11 = (uint)pDVar6 & 1;
            pDVar5 = pDVar6;
            if (((ulong)pDVar6 & 1) != 0) {
              pDVar5 = pDVar14;
            }
            uVar12._0_4_ = pDVar5->index;
            uVar12._4_4_ = pDVar5->ref;
            piVar1 = (int *)((uVar12 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            piVar1 = (int *)(((ulong)pDVar5->next & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar8 = local_50;
            if (pDVar9 == zero) {
              pCVar7 = ZeroCase(dd,node,(Conjuncts *)pDVar5,ghTable,local_58,(uint)(dVar17 < dVar16)
                               );
joined_r0x00611d50:
              if (((ulong)pDVar6 & 1) == 0) {
                return pCVar7;
              }
              free(pDVar14);
              return pCVar7;
            }
            goto LAB_00611b53;
          }
          Cudd_RecursiveDeref(dd,*(DdNode **)local_50);
          Cudd_RecursiveDeref(dd,pDVar5->next);
          uVar11 = uVar15;
        }
        if (uVar11 == 0) {
          return (Conjuncts *)0x0;
        }
        goto LAB_00611f13;
      }
    }
    else if ((int)((uint)approxDistance >> 2) < iVar4) goto LAB_006118a0;
    pDVar5 = (DdNode *)malloc(0x10);
    if (pDVar5 == (DdNode *)0x0) {
LAB_00611856:
      dd->errorCode = CUDD_MEMORY_OUT;
      return (Conjuncts *)0x0;
    }
    doubleDummy._0_4_ = 0;
    iVar4 = st__lookup_int(ghTable,(char *)piVar10,(int *)&doubleDummy);
    if (iVar4 == 0) {
      if (lastTimeG == 0) {
        *(DdNode **)pDVar5 = node;
        pDVar5->next = one;
        doubleDummy._0_4_ = 1;
        value = (char *)0x1;
      }
      else {
        *(DdNode **)pDVar5 = one;
        pDVar5->next = node;
        doubleDummy._0_4_ = 2;
        value = (char *)0x2;
      }
      lastTimeG = (long)(lastTimeG == 0);
      iVar4 = st__insert(ghTable,(char *)piVar10,value);
      if (iVar4 == -10000) {
        dd->errorCode = CUDD_MEMORY_OUT;
LAB_00611f13:
        free(pDVar5);
        return (Conjuncts *)0x0;
      }
      goto LAB_0061174c;
    }
    if ((int)doubleDummy == 1) {
      *(DdNode **)pDVar5 = node;
      pDVar5->next = one;
      goto LAB_0061174c;
    }
    if ((int)doubleDummy == 3) {
      if (lastTimeG == 0) {
        *(DdNode **)pDVar5 = node;
        pDVar5->next = one;
        lastTimeG = 1;
      }
      else {
        *(DdNode **)pDVar5 = one;
        pDVar5->next = node;
        lastTimeG = 0;
      }
      goto LAB_0061174c;
    }
    *(DdNode **)pDVar5 = one;
  }
  pDVar5->next = node;
LAB_0061174c:
  return (Conjuncts *)((ulong)pDVar5 | 1);
}

Assistant:

static Conjuncts *
BuildConjuncts(
  DdManager * dd,
  DdNode * node,
  st__table * distanceTable,
  st__table * cacheTable,
  int approxDistance,
  int maxLocalRef,
  st__table * ghTable,
  st__table * mintermTable)
{
    int topid, distance;
    Conjuncts *factorsNv = NULL, *factorsNnv = NULL, *factors;
    Conjuncts *dummy;
    DdNode *N, *Nv, *Nnv, *temp, *g1, *g2, *h1, *h2, *topv;
    double minNv = 0.0, minNnv = 0.0;
    double *doubleDummy;
    int switched =0;
    int outOfMem;
    int freeNv = 0, freeNnv = 0, freeTemp;
    NodeStat *nodeStat;
    int value;

    /* if f is constant, return (f,f) */
    if (Cudd_IsConstant(node)) {
        factors = ABC_ALLOC(Conjuncts, 1);
        if (factors == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        factors->g = node;
        factors->h = node;
        return(FactorsComplement(factors));
    }

    /* If result (a pair of conjuncts) in cache, return the factors. */
    if ( st__lookup(cacheTable, (const char *)node, (char **)&dummy)) {
        factors = dummy;
        return(factors);
    }
    
    /* check distance and local reference count of this node */
    N = Cudd_Regular(node);
    if (! st__lookup(distanceTable, (const char *)N, (char **)&nodeStat)) {
        (void) fprintf(dd->err, "Not in table, Something wrong\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return(NULL);
    }
    distance = nodeStat->distance;

    /* at or below decomposition point, return (f, 1) */
    if (((nodeStat->localRef > maxLocalRef*2/3) &&
         (distance < approxDistance*2/3)) ||
            (distance <= approxDistance/4)) {
        factors = ABC_ALLOC(Conjuncts, 1);
        if (factors == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        /* alternate assigning (f,1) */
        value = 0;
        if ( st__lookup_int(ghTable, (char *)Cudd_Regular(node), &value)) {
            if (value == 3) {
                if (!lastTimeG) {
                    factors->g = node;
                    factors->h = one;
                    lastTimeG = 1;
                } else {
                    factors->g = one;
                    factors->h = node;
                    lastTimeG = 0; 
                }
            } else if (value == 1) {
                factors->g = node;
                factors->h = one;
            } else {
                factors->g = one;
                factors->h = node;
            }
        } else if (!lastTimeG) {
            factors->g = node;
            factors->h = one;
            lastTimeG = 1;
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(node), (char *)(long)value) == st__OUT_OF_MEM) {
                dd->errorCode = CUDD_MEMORY_OUT;
                ABC_FREE(factors);
                return NULL;
            }
        } else {
            factors->g = one;
            factors->h = node;
            lastTimeG = 0;
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(node), (char *)(long)value) == st__OUT_OF_MEM) {
                dd->errorCode = CUDD_MEMORY_OUT;
                ABC_FREE(factors);
                return NULL;
            }
        }
        return(FactorsComplement(factors));
    }
    
    /* get the children and recur */
    Nv = cuddT(N);
    Nnv = cuddE(N);
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* Choose which subproblem to solve first based on the number of
     * minterms. We go first where there are more minterms.
     */
    if (!Cudd_IsConstant(Nv)) {
        if (! st__lookup(mintermTable, (const char *)Nv, (char **)&doubleDummy)) {
            (void) fprintf(dd->err, "Not in table: Something wrong\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
        minNv = *doubleDummy;
    }
    
    if (!Cudd_IsConstant(Nnv)) {
        if (! st__lookup(mintermTable, (const char *)Nnv, (char **)&doubleDummy)) {
            (void) fprintf(dd->err, "Not in table: Something wrong\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
        minNnv = *doubleDummy;
    }
    
    if (minNv < minNnv) {
        temp = Nv;
        Nv = Nnv;
        Nnv = temp;
        switched = 1;
    }

    /* build gt, ht recursively */
    if (Nv != zero) {
        factorsNv = BuildConjuncts(dd, Nv, distanceTable,
                                   cacheTable, approxDistance, maxLocalRef, 
                                   ghTable, mintermTable);
        if (factorsNv == NULL) return(NULL);
        freeNv = FactorsNotStored(factorsNv);
        factorsNv = (freeNv) ? FactorsUncomplement(factorsNv) : factorsNv;
        cuddRef(factorsNv->g);
        cuddRef(factorsNv->h);
        
        /* Deal with the zero case */
        if (Nnv == zero) {
            /* is responsible for freeing factorsNv */
            factors = ZeroCase(dd, node, factorsNv, ghTable,
                               cacheTable, switched);
            if (freeNv) ABC_FREE(factorsNv);
            return(factors);
        }
    }

    /* build ge, he recursively */
    if (Nnv != zero) {
        factorsNnv = BuildConjuncts(dd, Nnv, distanceTable,
                                    cacheTable, approxDistance, maxLocalRef,
                                    ghTable, mintermTable);
        if (factorsNnv == NULL) {
            Cudd_RecursiveDeref(dd, factorsNv->g);
            Cudd_RecursiveDeref(dd, factorsNv->h);
            if (freeNv) ABC_FREE(factorsNv);
            return(NULL);
        }
        freeNnv = FactorsNotStored(factorsNnv);
        factorsNnv = (freeNnv) ? FactorsUncomplement(factorsNnv) : factorsNnv;
        cuddRef(factorsNnv->g);
        cuddRef(factorsNnv->h);
        
        /* Deal with the zero case */
        if (Nv == zero) {
            /* is responsible for freeing factorsNv */
            factors = ZeroCase(dd, node, factorsNnv, ghTable,
                               cacheTable, switched);
            if (freeNnv) ABC_FREE(factorsNnv);
            return(factors);
        }
    }

    /* construct the 2 pairs */
    /* g1 = x*gt + x'*ge; h1 = x*ht + x'*he; */
    /* g2 = x*gt + x'*he; h2 = x*ht + x'*ge */
    if (switched) {
        factors = factorsNnv;
        factorsNnv = factorsNv;
        factorsNv = factors;
        freeTemp = freeNv;
        freeNv = freeNnv;
        freeNnv = freeTemp;
    }

    /* Build the factors for this node. */
    topid = N->index;
    topv = dd->vars[topid];
    
    g1 = cuddBddIteRecur(dd, topv, factorsNv->g, factorsNnv->g);
    if (g1 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }

    cuddRef(g1);

    h1 = cuddBddIteRecur(dd, topv, factorsNv->h, factorsNnv->h);
    if (h1 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        Cudd_RecursiveDeref(dd, g1);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }

    cuddRef(h1);

    g2 = cuddBddIteRecur(dd, topv, factorsNv->g, factorsNnv->h);
    if (g2 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }
    cuddRef(g2);
    Cudd_RecursiveDeref(dd, factorsNv->g);
    Cudd_RecursiveDeref(dd, factorsNnv->h);

    h2 = cuddBddIteRecur(dd, topv, factorsNv->h, factorsNnv->g);
    if (h2 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        Cudd_RecursiveDeref(dd, g2);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }
    cuddRef(h2);
    Cudd_RecursiveDeref(dd, factorsNv->h);
    Cudd_RecursiveDeref(dd, factorsNnv->g);
    if (freeNv) ABC_FREE(factorsNv);
    if (freeNnv) ABC_FREE(factorsNnv);

    /* check for each pair in tables and choose one */
    factors = CheckInTables(node, g1, h1, g2, h2, ghTable, cacheTable, &outOfMem);
    if (outOfMem) {
        dd->errorCode = CUDD_MEMORY_OUT;
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        Cudd_RecursiveDeref(dd, g2);
        Cudd_RecursiveDeref(dd, h2);
        return(NULL);
    }
    if (factors != NULL) {
        if ((factors->g == g1) || (factors->g == h1)) {
            Cudd_RecursiveDeref(dd, g2);
            Cudd_RecursiveDeref(dd, h2);
        } else {
            Cudd_RecursiveDeref(dd, g1);
            Cudd_RecursiveDeref(dd, h1);
        }
        return(factors);
    }

    /* if not in tables, pick one pair */
    factors = PickOnePair(node,g1, h1, g2, h2, ghTable, cacheTable);
    if (factors == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        Cudd_RecursiveDeref(dd, g2);
        Cudd_RecursiveDeref(dd, h2);
    } else {
        /* now free what was created and not used */
        if ((factors->g == g1) || (factors->g == h1)) {
            Cudd_RecursiveDeref(dd, g2);
            Cudd_RecursiveDeref(dd, h2);
        } else {
            Cudd_RecursiveDeref(dd, g1);
            Cudd_RecursiveDeref(dd, h1);
        }
    }
        
    return(factors);
    
}